

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::CheckStatusErrorsTest::PrepareObjects
          (CheckStatusErrorsTest *this)

{
  code *pcVar1;
  char cVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  bool local_19;
  bool is_target;
  Functions *gl;
  CheckStatusErrorsTest *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar6 + 0x6d0))(1,&this->m_fbo_valid);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1946);
  (**(code **)(lVar6 + 0x78))(0x8d40,this->m_fbo_valid);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1949);
  local_19 = true;
  while (local_19) {
    this->m_target_invalid = this->m_target_invalid + 1;
    local_19 = this->m_target_invalid == 0x8ca8 || this->m_target_invalid == 0x8d40;
    if (this->m_target_invalid == 0x8ca9) {
      local_19 = true;
    }
  }
  do {
    pcVar1 = *(code **)(lVar6 + 0xc88);
    this->m_fbo_invalid = this->m_fbo_invalid + 1;
    cVar2 = (*pcVar1)();
  } while (cVar2 != '\0');
  return;
}

Assistant:

void CheckStatusErrorsTest::PrepareObjects()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Valid objects. */
	gl.genFramebuffers(1, &m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	/* Invalid target. */
	bool is_target = true;

	while (is_target)
	{
		is_target = false;

		++m_target_invalid;

		if (GL_FRAMEBUFFER == m_target_invalid)
		{
			is_target = true;
		}

		if (GL_READ_FRAMEBUFFER == m_target_invalid)
		{
			is_target = true;
		}

		if (GL_DRAW_FRAMEBUFFER == m_target_invalid)
		{
			is_target = true;
		}
	}
	/* Invalid objects. */
	while (gl.isFramebuffer(++m_fbo_invalid))
		;
}